

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall
BuildWithDepsLogTestDiscoveredDepDuringBuildChanged::Run
          (BuildWithDepsLogTestDiscoveredDepDuringBuildChanged *this)

{
  VirtualFileSystem *pVVar1;
  int *piVar2;
  BuildConfig *config;
  StatusPrinter *status;
  Plan *pPVar3;
  __node_base *p_Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long lVar6;
  Test *pTVar7;
  unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> uVar8;
  unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> uVar9;
  bool bVar10;
  int iVar11;
  LoadStatus LVar12;
  Node *pNVar13;
  string local_378;
  VirtualFileSystem *local_358;
  string err;
  DepsLog deps_log;
  Builder builder;
  State state;
  BuildLog build_log;
  
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  pPVar3 = &builder.plan_;
  builder.state_ = (State *)pPVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"in1","");
  p_Var4 = &state.paths_._M_h._M_before_begin;
  state.paths_._M_h._M_buckets = &p_Var4->_M_nxt;
  std::__cxx11::string::_M_construct<char_const*>((string *)&state,"");
  pVVar1 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_;
  VirtualFileSystem::Create(pVVar1,(string *)&builder,(string *)&state);
  if ((__node_base *)state.paths_._M_h._M_buckets != p_Var4) {
    operator_delete(state.paths_._M_h._M_buckets,
                    (ulong)((long)&(state.paths_._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if (builder.state_ != (State *)pPVar3) {
    operator_delete(builder.state_,builder.plan_.want_._M_t._M_impl._0_8_ + 1);
  }
  piVar2 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.now_;
  *piVar2 = *piVar2 + 1;
  BuildLog::BuildLog(&build_log);
  State::State(&state);
  iVar11 = g_current_test->assertion_failures_;
  AssertParse(&state,
              "rule touch-out-implicit-dep\n  command = touch $out ; sleep 1 ; touch $test_dependency\nrule generate-depfile\n  command = touch $out ; echo \"$out: $test_dependency\" > $depfile\nbuild out1: touch-out-implicit-dep in1\n  test_dependency = inimp\nbuild out2: generate-depfile in1 || out1\n  test_dependency = inimp\n  depfile = out2.d\n  deps = gcc\n"
              ,(ManifestParserOptions)0x0);
  pTVar7 = g_current_test;
  if (iVar11 == g_current_test->assertion_failures_) {
    paVar5 = &deps_log.file_path_.field_2;
    deps_log.needs_recompaction_ = false;
    deps_log.file_ = (FILE *)0x0;
    deps_log.file_path_._M_string_length = 0;
    deps_log.file_path_.field_2._M_local_buf[0] = '\0';
    deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_358 = pVVar1;
    deps_log.file_path_._M_dataplus._M_p = (pointer)paVar5;
    builder.state_ = (State *)pPVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"ninja_deps","");
    bVar10 = DepsLog::OpenForWrite(&deps_log,(string *)&builder,&err);
    bVar10 = testing::Test::Check
                       (pTVar7,bVar10,
                        "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                        ,0xa8f,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
    if (builder.state_ != (State *)&builder.plan_) {
      operator_delete(builder.state_,builder.plan_.want_._M_t._M_impl._0_8_ + 1);
    }
    pTVar7 = g_current_test;
    if (!bVar10) {
LAB_0013c2c8:
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      DepsLog::~DepsLog(&deps_log);
      goto LAB_0013c2d6;
    }
    iVar11 = std::__cxx11::string::compare((char *)&err);
    bVar10 = testing::Test::Check
                       (pTVar7,iVar11 == 0,
                        "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                        ,0xa90,"\"\" == err");
    if (!bVar10) goto LAB_0013c2c8;
    config = &(this->super_BuildWithDepsLogTest).super_BuildTest.config_;
    status = &(this->super_BuildWithDepsLogTest).super_BuildTest.status_;
    Builder::Builder(&builder,&state,config,&build_log,&deps_log,&local_358->super_DiskInterface,
                     &status->super_Status,0);
    uVar8._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
         (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
         &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_;
    uVar9._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
         uVar8._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
         super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
         super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)
        builder.command_runner_._M_t.
        super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
        super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
        super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
      lVar6 = *(long *)builder.command_runner_._M_t.
                       super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                       super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      builder.command_runner_._M_t.
      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           uVar8._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t
           .super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
           super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      (**(code **)(lVar6 + 8))();
      uVar9._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           builder.command_runner_._M_t.
           super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
           super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
           super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    }
    builder.command_runner_._M_t.
    super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
         uVar9._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
         super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
         super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    pTVar7 = g_current_test;
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"out2","");
    pNVar13 = Builder::AddTarget(&builder,&local_378,&err);
    testing::Test::Check
              (pTVar7,pNVar13 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xa94,"builder.AddTarget(\"out2\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    pTVar7 = g_current_test;
    bVar10 = Builder::AlreadyUpToDate(&builder);
    testing::Test::Check
              (pTVar7,!bVar10,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xa95,"builder.AlreadyUpToDate()");
    pTVar7 = g_current_test;
    bVar10 = Builder::Build(&builder,&err);
    testing::Test::Check
              (pTVar7,bVar10,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xa97,"builder.Build(&err)");
    pTVar7 = g_current_test;
    bVar10 = Builder::AlreadyUpToDate(&builder);
    testing::Test::Check
              (pTVar7,bVar10,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xa98,"builder.AlreadyUpToDate()");
    DepsLog::Close(&deps_log);
    builder.command_runner_._M_t.
    super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
         (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
         (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0;
    Builder::~Builder(&builder);
    DepsLog::~DepsLog(&deps_log);
    if (state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    state.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001fda68;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
    ::~_Rb_tree(&state.bindings_.rules_._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&state.bindings_.bindings_._M_t);
    if (state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
    ::~_Rb_tree(&state.pools_._M_t);
    std::
    _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&state);
    piVar2 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.now_;
    *piVar2 = *piVar2 + 1;
    builder.state_ = (State *)&builder.plan_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"in1","");
    state.paths_._M_h._M_buckets = &p_Var4->_M_nxt;
    std::__cxx11::string::_M_construct<char_const*>((string *)&state,"");
    VirtualFileSystem::Create(local_358,(string *)&builder,(string *)&state);
    if ((__node_base *)state.paths_._M_h._M_buckets != p_Var4) {
      operator_delete(state.paths_._M_h._M_buckets,
                      (ulong)((long)&(state.paths_._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (builder.state_ != (State *)&builder.plan_) {
      operator_delete(builder.state_,builder.plan_.want_._M_t._M_impl._0_8_ + 1);
    }
    State::State(&state);
    iVar11 = g_current_test->assertion_failures_;
    AssertParse(&state,
                "rule touch-out-implicit-dep\n  command = touch $out ; sleep 1 ; touch $test_dependency\nrule generate-depfile\n  command = touch $out ; echo \"$out: $test_dependency\" > $depfile\nbuild out1: touch-out-implicit-dep in1\n  test_dependency = inimp\nbuild out2: generate-depfile in1 || out1\n  test_dependency = inimp\n  depfile = out2.d\n  deps = gcc\n"
                ,(ManifestParserOptions)0x0);
    pTVar7 = g_current_test;
    if (iVar11 == g_current_test->assertion_failures_) {
      deps_log.needs_recompaction_ = false;
      deps_log.file_ = (FILE *)0x0;
      deps_log.file_path_._M_string_length = 0;
      deps_log.file_path_.field_2._M_local_buf[0] = '\0';
      deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      builder.state_ = (State *)&builder.plan_;
      deps_log.file_path_._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"ninja_deps","");
      LVar12 = DepsLog::Load(&deps_log,(string *)&builder,&state,&err);
      bVar10 = testing::Test::Check
                         (pTVar7,LVar12 != LOAD_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                          ,0xaa6,"deps_log.Load(\"ninja_deps\", &state, &err)");
      if (builder.state_ != (State *)&builder.plan_) {
        operator_delete(builder.state_,builder.plan_.want_._M_t._M_impl._0_8_ + 1);
      }
      pTVar7 = g_current_test;
      if (bVar10) {
        builder.state_ = (State *)&builder.plan_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"ninja_deps","");
        bVar10 = DepsLog::OpenForWrite(&deps_log,(string *)&builder,&err);
        bVar10 = testing::Test::Check
                           (pTVar7,bVar10,
                            "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                            ,0xaa7,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
        if (builder.state_ != (State *)&builder.plan_) {
          operator_delete(builder.state_,builder.plan_.want_._M_t._M_impl._0_8_ + 1);
        }
        pTVar7 = g_current_test;
        if (bVar10) {
          iVar11 = std::__cxx11::string::compare((char *)&err);
          bVar10 = testing::Test::Check
                             (pTVar7,iVar11 == 0,
                              "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                              ,0xaa8,"\"\" == err");
          if (bVar10) {
            Builder::Builder(&builder,&state,config,&build_log,&deps_log,
                             &local_358->super_DiskInterface,&status->super_Status,0);
            uVar9._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
            _M_t.super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
            super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                 uVar8._M_t.
                 super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                 super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                 super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
            if ((__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)
                builder.command_runner_._M_t.
                super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
              lVar6 = *(long *)builder.command_runner_._M_t.
                               super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>
                               .super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
              builder.command_runner_._M_t.
              super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
              super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
              super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                   uVar8._M_t.
                   super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                   super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                   super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
              (**(code **)(lVar6 + 8))();
              uVar9._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
              _M_t.super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
              super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                   builder.command_runner_._M_t.
                   super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                   super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                   super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
            }
            builder.command_runner_._M_t.
            super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
            super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
            super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                 uVar9._M_t.
                 super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                 super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                 super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
            pTVar7 = g_current_test;
            local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"out2","");
            pNVar13 = Builder::AddTarget(&builder,&local_378,&err);
            testing::Test::Check
                      (pTVar7,pNVar13 != (Node *)0x0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0xaac,"builder.AddTarget(\"out2\", &err)");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1
                             );
            }
            pTVar7 = g_current_test;
            bVar10 = Builder::AlreadyUpToDate(&builder);
            testing::Test::Check
                      (pTVar7,!bVar10,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0xaad,"builder.AlreadyUpToDate()");
            pTVar7 = g_current_test;
            bVar10 = Builder::Build(&builder,&err);
            testing::Test::Check
                      (pTVar7,bVar10,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0xaaf,"builder.Build(&err)");
            pTVar7 = g_current_test;
            bVar10 = Builder::AlreadyUpToDate(&builder);
            testing::Test::Check
                      (pTVar7,bVar10,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0xab0,"builder.AlreadyUpToDate()");
            DepsLog::Close(&deps_log);
            builder.command_runner_._M_t.
            super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
            super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
            super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                 (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
                 (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0;
            Builder::~Builder(&builder);
            DepsLog::~DepsLog(&deps_log);
            State::~State(&state);
            piVar2 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.now_;
            *piVar2 = *piVar2 + 1;
            State::State(&state);
            iVar11 = g_current_test->assertion_failures_;
            AssertParse(&state,
                        "rule touch-out-implicit-dep\n  command = touch $out ; sleep 1 ; touch $test_dependency\nrule generate-depfile\n  command = touch $out ; echo \"$out: $test_dependency\" > $depfile\nbuild out1: touch-out-implicit-dep in1\n  test_dependency = inimp\nbuild out2: generate-depfile in1 || out1\n  test_dependency = inimp\n  depfile = out2.d\n  deps = gcc\n"
                        ,(ManifestParserOptions)0x0);
            pTVar7 = g_current_test;
            if (iVar11 == g_current_test->assertion_failures_) {
              deps_log.needs_recompaction_ = false;
              deps_log.file_ = (FILE *)0x0;
              deps_log.file_path_._M_string_length = 0;
              deps_log.file_path_.field_2._M_local_buf[0] = '\0';
              deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pPVar3 = &builder.plan_;
              deps_log.file_path_._M_dataplus._M_p = (pointer)paVar5;
              builder.state_ = (State *)pPVar3;
              std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"ninja_deps","");
              LVar12 = DepsLog::Load(&deps_log,(string *)&builder,&state,&err);
              pVVar1 = local_358;
              bVar10 = testing::Test::Check
                                 (pTVar7,LVar12 != LOAD_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                                  ,0xabd,"deps_log.Load(\"ninja_deps\", &state, &err)");
              if (builder.state_ != (State *)pPVar3) {
                operator_delete(builder.state_,builder.plan_.want_._M_t._M_impl._0_8_ + 1);
              }
              pTVar7 = g_current_test;
              if (bVar10) {
                builder.state_ = (State *)pPVar3;
                std::__cxx11::string::_M_construct<char_const*>((string *)&builder,"ninja_deps","");
                bVar10 = DepsLog::OpenForWrite(&deps_log,(string *)&builder,&err);
                bVar10 = testing::Test::Check
                                   (pTVar7,bVar10,
                                    "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                                    ,0xabe,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
                if (builder.state_ != (State *)pPVar3) {
                  operator_delete(builder.state_,builder.plan_.want_._M_t._M_impl._0_8_ + 1);
                }
                pTVar7 = g_current_test;
                if (!bVar10) goto LAB_0013c3df;
                iVar11 = std::__cxx11::string::compare((char *)&err);
                bVar10 = testing::Test::Check
                                   (pTVar7,iVar11 == 0,
                                    "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                                    ,0xabf,"\"\" == err");
                if (bVar10) {
                  Builder::Builder(&builder,&state,config,&build_log,&deps_log,
                                   &pVVar1->super_DiskInterface,&status->super_Status,0);
                  if ((__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)
                      builder.command_runner_._M_t.
                      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t
                      .super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl !=
                      (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
                    lVar6 = *(long *)builder.command_runner_._M_t.
                                     super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>
                                     .super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
                    builder.command_runner_._M_t.
                    super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                         uVar8._M_t.
                         super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>
                         .super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
                    (**(code **)(lVar6 + 8))();
                    uVar8._M_t.
                    super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                         builder.command_runner_._M_t.
                         super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>
                         .super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
                  }
                  builder.command_runner_._M_t.
                  super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                  super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                  super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                       uVar8._M_t.
                       super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                       super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
                  pTVar7 = g_current_test;
                  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"out2","");
                  pNVar13 = Builder::AddTarget(&builder,&local_378,&err);
                  testing::Test::Check
                            (pTVar7,pNVar13 != (Node *)0x0,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0xac3,"builder.AddTarget(\"out2\", &err)");
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_378._M_dataplus._M_p != &local_378.field_2) {
                    operator_delete(local_378._M_dataplus._M_p,
                                    local_378.field_2._M_allocated_capacity + 1);
                  }
                  pTVar7 = g_current_test;
                  bVar10 = Builder::AlreadyUpToDate(&builder);
                  testing::Test::Check
                            (pTVar7,bVar10,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0xac4,"builder.AlreadyUpToDate()");
                  DepsLog::Close(&deps_log);
                  builder.command_runner_._M_t.
                  super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                  super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                  super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                       (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>
                        )(__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0;
                  Builder::~Builder(&builder);
                }
                else {
                  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
                }
              }
              else {
LAB_0013c3df:
                g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
              }
              DepsLog::~DepsLog(&deps_log);
            }
            else {
              g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
            }
            State::~State(&state);
            goto LAB_0013c352;
          }
        }
      }
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      DepsLog::~DepsLog(&deps_log);
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    if (state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_0013c2d6:
    if (state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  state.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001fda68;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&state.bindings_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&state.bindings_.bindings_._M_t);
  if (state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&state.pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&state);
LAB_0013c352:
  BuildLog::~BuildLog(&build_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)err._M_dataplus._M_p != &err.field_2) {
    operator_delete(err._M_dataplus._M_p,
                    CONCAT71(err.field_2._M_allocated_capacity._1_7_,err.field_2._M_local_buf[0]) +
                    1);
  }
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, DiscoveredDepDuringBuildChanged) {
  string err;
  const char* manifest =
    "rule touch-out-implicit-dep\n"
    "  command = touch $out ; sleep 1 ; touch $test_dependency\n"
    "rule generate-depfile\n"
    "  command = touch $out ; echo \"$out: $test_dependency\" > $depfile\n"
    "build out1: touch-out-implicit-dep in1\n"
    "  test_dependency = inimp\n"
    "build out2: generate-depfile in1 || out1\n"
    "  test_dependency = inimp\n"
    "  depfile = out2.d\n"
    "  deps = gcc\n";

  fs_.Create("in1", "");
  fs_.Tick();

  BuildLog build_log;

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, &build_log, &deps_log, &fs_, &status_, 0);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out2", &err));
    EXPECT_FALSE(builder.AlreadyUpToDate());

    EXPECT_TRUE(builder.Build(&err));
    EXPECT_TRUE(builder.AlreadyUpToDate());

    deps_log.Close();
    builder.command_runner_.release();
  }

  fs_.Tick();
  fs_.Create("in1", "");

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, &build_log, &deps_log, &fs_, &status_, 0);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out2", &err));
    EXPECT_FALSE(builder.AlreadyUpToDate());

    EXPECT_TRUE(builder.Build(&err));
    EXPECT_TRUE(builder.AlreadyUpToDate());

    deps_log.Close();
    builder.command_runner_.release();
  }

  fs_.Tick();

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, &build_log, &deps_log, &fs_, &status_, 0);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out2", &err));
    EXPECT_TRUE(builder.AlreadyUpToDate());

    deps_log.Close();
    builder.command_runner_.release();
  }
}